

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O3

bool __thiscall QHttp2Connection::streamWasResetLocally(QHttp2Connection *this,quint32 streamID)

{
  long lVar1;
  quint32 *pqVar2;
  long lVar3;
  
  if (*(long *)(this + 0x1e8) != 0) {
    lVar3 = 0;
    while (*(long *)(this + 0x1e8) << 2 != lVar3) {
      lVar1 = lVar3 + 4;
      pqVar2 = (quint32 *)(*(long *)(this + 0x1e0) + lVar3);
      lVar3 = lVar1;
      if (*pqVar2 == streamID) {
        return lVar1 != 0;
      }
    }
  }
  return false;
}

Assistant:

constexpr qsizetype size() const noexcept
    {
#if __has_cpp_attribute(assume)
        constexpr size_t MaxSize = maxSize();
        [[assume(size_t(d.size) <= MaxSize)]];
#endif
        return d.size;
    }